

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphics.cpp
# Opt level: O2

void __thiscall piksel::Graphics::rotate(Graphics *this,float rad)

{
  stack<piksel::State,_std::deque<piksel::State,_std::allocator<piksel::State>_>_> *psVar1;
  vec<3,_float,_(glm::qualifier)0> *in_RCX;
  _Elt_pointer pSVar2;
  anon_union_16_4_ea85571f_for_vec<4,_float,_(glm::qualifier)0>_3 local_60;
  anon_union_16_4_ea85571f_for_vec<4,_float,_(glm::qualifier)0>_3 local_50;
  undefined8 local_40;
  undefined8 uStack_38;
  undefined8 local_30;
  undefined8 uStack_28;
  undefined8 local_20;
  undefined8 uStack_18;
  
  psVar1 = this->stateStack;
  pSVar2 = (psVar1->c).super__Deque_base<piksel::State,_std::allocator<piksel::State>_>._M_impl.
           super__Deque_impl_data._M_finish._M_cur;
  if (pSVar2 == (psVar1->c).super__Deque_base<piksel::State,_std::allocator<piksel::State>_>._M_impl
                .super__Deque_impl_data._M_finish._M_first) {
    pSVar2 = (psVar1->c).super__Deque_base<piksel::State,_std::allocator<piksel::State>_>._M_impl.
             super__Deque_impl_data._M_finish._M_node[-1] + 2;
  }
  local_60._0_8_ = 0;
  local_60.field_0.z = 1.0;
  glm::rotate<float,(glm::qualifier)0>
            ((mat<4,_4,_float,_(glm::qualifier)0> *)&local_50.field_0,
             (glm *)&pSVar2[-1].shaderRelevantState.modelMatrix,
             (mat<4,_4,_float,_(glm::qualifier)0> *)&local_60.field_0,rad,in_RCX);
  *(undefined8 *)&pSVar2[-1].shaderRelevantState.modelMatrix.value[3].field_0 = local_20;
  *(undefined8 *)((long)&pSVar2[-1].shaderRelevantState.modelMatrix.value[3].field_0 + 8) =
       uStack_18;
  *(undefined8 *)&pSVar2[-1].shaderRelevantState.modelMatrix.value[2].field_0 = local_30;
  *(undefined8 *)((long)&pSVar2[-1].shaderRelevantState.modelMatrix.value[2].field_0 + 8) =
       uStack_28;
  *(undefined8 *)&pSVar2[-1].shaderRelevantState.modelMatrix.value[1].field_0 = local_40;
  *(undefined8 *)((long)&pSVar2[-1].shaderRelevantState.modelMatrix.value[1].field_0 + 8) =
       uStack_38;
  *(undefined8 *)&pSVar2[-1].shaderRelevantState.modelMatrix.value[0].field_0 = local_50._0_8_;
  *(undefined8 *)((long)&pSVar2[-1].shaderRelevantState.modelMatrix.value[0].field_0 + 8) =
       local_50._8_8_;
  return;
}

Assistant:

State& Graphics::peek() {
    return stateStack.top();
}